

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O1

int condvar_timedwait(worker_config_conflict *c,int *flag)

{
  uv_mutex_t *puVar1;
  sa_family_t sVar2;
  uint uVar3;
  int iVar4;
  int extraout_EAX;
  long lVar5;
  uv_loop_t *loop;
  ulong uVar6;
  anon_union_28_2_e90107a3_for_address *paVar7;
  uv_interface_address_t *addresses;
  uv_handle_t *handle;
  bool bVar8;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_4e0 [48];
  uv_handle_t *puStack_4b0;
  sockaddr_in6 sStack_4a8;
  sockaddr_in sStack_488;
  uv_connect_t uStack_478;
  uv_connect_t uStack_410;
  uv_tcp_t uStack_3a8;
  uv_tcp_t uStack_2d0;
  uv_mutex_t *puStack_1f8;
  ulong uStack_1f0;
  long lStack_1e0;
  long lStack_1d8;
  worker_config_conflict wStack_1d0;
  worker_config_conflict *pwStack_118;
  undefined8 uStack_110;
  long lStack_108;
  uv_thread_t uStack_100;
  worker_config_conflict wStack_f8;
  worker_config_conflict *pwStack_40;
  long local_38;
  long local_30;
  
  puVar1 = &c->mutex;
  pwStack_40 = (worker_config_conflict *)0x1803e5;
  uv_mutex_lock(puVar1);
  pwStack_40 = (worker_config_conflict *)0x1803ed;
  uv_sem_post(&c->sem_waiting);
  do {
    pwStack_40 = (worker_config_conflict *)0x180401;
    uVar3 = uv_cond_timedwait(&c->cond,puVar1,1000000000);
    local_30 = (long)(int)uVar3;
    local_38 = 0;
    if (local_30 != 0) {
      pwStack_40 = (worker_config_conflict *)0x18046d;
      condvar_timedwait_cold_1();
      goto LAB_0018046d;
    }
    lVar5 = (long)*flag;
    local_30 = 0;
  } while (lVar5 == 0);
  local_30 = 1;
  local_38 = lVar5;
  if (lVar5 == 1) {
    pwStack_40 = (worker_config_conflict *)0x180445;
    uv_mutex_unlock(puVar1);
    pwStack_40 = (worker_config_conflict *)0x180451;
    uv_sem_wait(&c->sem_signaled);
    return uVar3;
  }
LAB_0018046d:
  pwStack_40 = (worker_config_conflict *)run_test_condvar_4;
  condvar_timedwait_cold_2();
  pwStack_118 = (worker_config_conflict *)0x1804a2;
  pwStack_40 = c;
  worker_config_init(&wStack_f8,1,condvar_signal,condvar_timedwait);
  pwStack_118 = (worker_config_conflict *)0x1804b6;
  iVar4 = uv_thread_create(&uStack_100,worker,&wStack_f8);
  lStack_108 = (long)iVar4;
  uStack_110 = 0;
  if (lStack_108 == 0) {
    pwStack_118 = (worker_config_conflict *)0x1804e3;
    (*wStack_f8.wait_cond)(&wStack_f8,&wStack_f8.posted_1);
    pwStack_118 = (worker_config_conflict *)0x1804f1;
    (*wStack_f8.signal_cond)(&wStack_f8,&wStack_f8.posted_2);
    pwStack_118 = (worker_config_conflict *)0x1804fb;
    iVar4 = uv_thread_join(&uStack_100);
    lStack_108 = (long)iVar4;
    uStack_110 = 0;
    if (lStack_108 == 0) {
      pwStack_118 = (worker_config_conflict *)0x18051f;
      worker_config_destroy(&wStack_f8);
      return 0;
    }
  }
  else {
    pwStack_118 = (worker_config_conflict *)0x180537;
    run_test_condvar_4_cold_1();
  }
  pwStack_118 = (worker_config_conflict *)run_test_condvar_5;
  run_test_condvar_4_cold_2();
  uStack_1f0 = 0x18055c;
  pwStack_118 = &wStack_f8;
  worker_config_init(&wStack_1d0,0,(signal_func)0x0,(wait_func)0x0);
  puVar1 = &wStack_1d0.mutex;
  uStack_1f0 = 0x180569;
  uv_mutex_lock(puVar1);
  lStack_1d8 = -0x6e;
  uStack_1f0 = 0x180587;
  iVar4 = uv_cond_timedwait(&wStack_1d0.cond,puVar1,100000000);
  lStack_1e0 = (long)iVar4;
  if (lStack_1d8 == lStack_1e0) {
    uStack_1f0 = 0x1805a2;
    uv_mutex_unlock(puVar1);
    uStack_1f0 = 0x1805ac;
    worker_config_destroy(&wStack_1d0);
    return 0;
  }
  uStack_1f0 = 0x1805c6;
  run_test_condvar_5_cold_1();
  auStack_4e0._24_8_ = (uv_close_cb)0x1805d6;
  puStack_1f8 = puVar1;
  uStack_1f0 = (ulong)uVar3;
  loop = uv_default_loop();
  auStack_4e0._24_8_ = (uv_close_cb)0x1805e9;
  iVar4 = uv_tcp_init(loop,&uStack_2d0);
  uStack_3a8.data = (void *)(long)iVar4;
  uStack_410.data = (void *)0x0;
  if ((uv_interface_address_t *)uStack_3a8.data == (uv_interface_address_t *)0x0) {
    auStack_4e0._24_8_ = (uv_close_cb)0x18062b;
    iVar4 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_488);
    uStack_3a8.data = (void *)(long)iVar4;
    uStack_410.data = (void *)0x0;
    if ((uv_interface_address_t *)uStack_3a8.data != (uv_interface_address_t *)0x0)
    goto LAB_00180853;
    auStack_4e0._24_8_ = (uv_close_cb)0x180678;
    iVar4 = uv_tcp_connect(&uStack_410,&uStack_2d0,(sockaddr *)&sStack_488,connect_4);
    uStack_3a8.data = (void *)(long)iVar4;
    uStack_478.data = (void *)0x0;
    if ((uv_interface_address_t *)uStack_3a8.data != (uv_interface_address_t *)0x0)
    goto LAB_00180868;
    auStack_4e0._24_8_ = (uv_close_cb)0x1806b0;
    iVar4 = uv_interface_addresses((uv_interface_address_t **)&uStack_3a8,(int *)&uStack_478);
    if (iVar4 != 0) {
LAB_001806b4:
      auStack_4e0._24_8_ = (uv_close_cb)0x1806be;
      iVar4 = uv_run(loop,UV_RUN_DEFAULT);
      auStack_4e0._40_8_ = SEXT48(iVar4);
      puStack_4b0 = (uv_handle_t *)0x0;
      if ((uv_handle_t *)auStack_4e0._40_8_ != (uv_handle_t *)0x0) goto LAB_0018087a;
      auStack_4e0._24_8_ = (uv_close_cb)0x1806ef;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      auStack_4e0._24_8_ = (uv_close_cb)0x1806f9;
      uv_run(loop,UV_RUN_DEFAULT);
      auStack_4e0._40_8_ = (uv_handle_t *)0x0;
      auStack_4e0._24_8_ = (uv_close_cb)0x18070a;
      iVar4 = uv_loop_close(loop);
      puStack_4b0 = (uv_handle_t *)(long)iVar4;
      if ((uv_handle_t *)auStack_4e0._40_8_ == puStack_4b0) {
        auStack_4e0._24_8_ = (uv_close_cb)0x180726;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00180889;
    }
    addresses = (uv_interface_address_t *)uStack_3a8.data;
    iVar4 = (int)uStack_478.data;
    if ((long)(int)uStack_478.data < 1) {
LAB_00180834:
      auStack_4e0._24_8_ = (uv_close_cb)0x180839;
      uv_free_interface_addresses(addresses,iVar4);
      goto LAB_001806b4;
    }
    paVar7 = (anon_union_28_2_e90107a3_for_address *)((long)uStack_3a8.data + 0x14);
    uVar6 = 1;
    do {
      sVar2 = (paVar7->address4).sin_family;
      if (sVar2 == 10) break;
      paVar7 = (anon_union_28_2_e90107a3_for_address *)((long)paVar7 + 0x60);
      bVar8 = uVar6 < (ulong)(long)(int)uStack_478.data;
      uVar6 = uVar6 + 1;
    } while (bVar8);
    auStack_4e0._24_8_ = (uv_close_cb)0x180777;
    uv_free_interface_addresses((uv_interface_address_t *)uStack_3a8.data,(int)uStack_478.data);
    if (sVar2 != 10) goto LAB_001806b4;
    auStack_4e0._24_8_ = (uv_close_cb)0x180791;
    iVar4 = uv_tcp_init(loop,&uStack_3a8);
    uStack_478.data = (void *)(long)iVar4;
    sStack_4a8.sin6_family = 0;
    sStack_4a8.sin6_port = 0;
    sStack_4a8.sin6_flowinfo = 0;
    if (uStack_478.data == (void *)0x0) {
      auStack_4e0._24_8_ = (uv_close_cb)0x1807c7;
      iVar4 = uv_ip6_addr("::",0x23a3,&sStack_4a8);
      uStack_478.data = (void *)(long)iVar4;
      auStack_4e0._40_8_ = (uv_handle_t *)0x0;
      if (uStack_478.data != (void *)0x0) goto LAB_001808a7;
      auStack_4e0._24_8_ = (uv_close_cb)0x180805;
      iVar4 = uv_tcp_connect(&uStack_478,&uStack_3a8,(sockaddr *)&sStack_4a8,connect_6);
      auStack_4e0._40_8_ = SEXT48(iVar4);
      puStack_4b0 = (uv_handle_t *)0x0;
      if ((uv_handle_t *)auStack_4e0._40_8_ != (uv_handle_t *)0x0) {
        addresses = (uv_interface_address_t *)(auStack_4e0 + 0x28);
        iVar4 = (int)&puStack_4b0;
        auStack_4e0._24_8_ = (uv_close_cb)0x180834;
        run_test_connect_unspecified_cold_6();
        goto LAB_00180834;
      }
      goto LAB_001806b4;
    }
  }
  else {
    auStack_4e0._24_8_ = (uv_close_cb)0x180853;
    run_test_connect_unspecified_cold_1();
LAB_00180853:
    auStack_4e0._24_8_ = (uv_close_cb)0x180868;
    run_test_connect_unspecified_cold_2();
LAB_00180868:
    auStack_4e0._24_8_ = (uv_close_cb)0x18087a;
    run_test_connect_unspecified_cold_3();
LAB_0018087a:
    auStack_4e0._24_8_ = (uv_close_cb)0x180889;
    run_test_connect_unspecified_cold_7();
LAB_00180889:
    auStack_4e0._24_8_ = (uv_close_cb)0x180898;
    run_test_connect_unspecified_cold_8();
  }
  auStack_4e0._24_8_ = (uv_close_cb)0x1808a7;
  run_test_connect_unspecified_cold_4();
LAB_001808a7:
  iVar4 = (int)auStack_4e0 + 0x28;
  auStack_4e0._24_8_ = connect_4;
  run_test_connect_unspecified_cold_5();
  auStack_4e0._24_8_ = SEXT48(iVar4);
  auStack_4e0._16_8_ = 0xffffffffffffff9d;
  if ((uv_close_cb)auStack_4e0._24_8_ != (uv_close_cb)0xffffffffffffff9d) {
    return iVar4;
  }
  iVar4 = (int)auStack_4e0 + 0x10;
  auStack_4e0._0_8_ = connect_6;
  connect_4_cold_1();
  auStack_4e0._0_8_ = SEXT48(iVar4);
  if ((void *)auStack_4e0._0_8_ != (void *)0xffffffffffffff9d) {
    return iVar4;
  }
  handle = (uv_handle_t *)auStack_4e0;
  connect_6_cold_1();
  iVar4 = uv_is_closing(handle);
  if (iVar4 != 0) {
    return iVar4;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

static int condvar_timedwait(worker_config* c, const int* flag) {
  int r;

  r = 0;

  uv_mutex_lock(&c->mutex);

  /* Tell signal'er that I am waiting. */
  uv_sem_post(&c->sem_waiting);

  /* Wait until I get a non-spurious signal. */
  do {
    r = uv_cond_timedwait(&c->cond, &c->mutex, (uint64_t)(1 * 1e9)); /* 1 s */
    ASSERT_OK(r); /* Should not time out. */
  } while (*flag == 0);
  ASSERT_EQ(1, *flag);

  uv_mutex_unlock(&c->mutex);

  /* Wait for my signal'er to finish. */
  uv_sem_wait(&c->sem_signaled);
  return r;
}